

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

void __thiscall
jsonnet::internal::FixIndentation::params
          (FixIndentation *this,Fodder *fodder_l,ArgParams *params,bool trailing_comma,
          Fodder *fodder_r,Indent *indent)

{
  pointer pAVar1;
  pointer pFVar2;
  undefined7 in_register_00000009;
  pointer pAVar3;
  iterator __end2;
  Fodder *fodder;
  pointer pAVar4;
  bool bVar5;
  Indent new_indent;
  Indent local_48;
  undefined4 local_3c;
  Fodder *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000009,trailing_comma);
  fill(this,fodder_l,false,false,indent->lineUp,indent->lineUp);
  local_48.lineUp = this->column + 1;
  this->column = local_48.lineUp;
  pAVar4 = (params->
           super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (params->
           super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pAVar3 = pAVar4;
  if (pAVar1 == pAVar4) {
    pAVar3 = (pointer)fodder_r;
  }
  pFVar2 = (pAVar3->idFodder).
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((pAVar3->idFodder).
       super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
       ._M_impl.super__Vector_impl_data._M_finish == pFVar2) || (pFVar2->kind == INTERSTITIAL)) {
    local_48.base = indent->base;
  }
  else {
    local_48.base = (this->opts).indent + indent->base;
    local_48.lineUp = local_48.base;
  }
  local_38 = fodder_r;
  if (pAVar1 != pAVar4) {
    bVar5 = true;
    fodder = &pAVar4->commaFodder;
    do {
      if (!bVar5) {
        this->column = this->column + 1;
      }
      fill(this,(Fodder *)((long)(fodder + -3) + 8),(bool)(~bVar5 & 1),true,local_48.lineUp,
           local_48.lineUp);
      this->column = this->column + *(int *)(*(long *)((long)(fodder + -2) + 8) + 8);
      if (*(long *)((long)(fodder + -1) + 0x10) != 0) {
        fill(this,(Fodder *)((long)(fodder + -2) + 0x10),false,false,local_48.lineUp,local_48.lineUp
            );
        this->column = this->column + 1;
        expr(this,*(AST **)((long)(fodder + -1) + 0x10),&local_48,false);
      }
      bVar5 = false;
      fill(this,fodder,false,false,local_48.lineUp,local_48.lineUp);
      pAVar4 = (pointer)(fodder + 1);
      fodder = (Fodder *)((long)(fodder + 3) + 0x10);
    } while (pAVar4 != pAVar1);
  }
  if ((char)local_3c != '\0') {
    this->column = this->column + 1;
  }
  fill(this,local_38,false,false,local_48.lineUp,indent->lineUp);
  this->column = this->column + 1;
  return;
}

Assistant:

void params(Fodder &fodder_l, ArgParams &params, bool trailing_comma, Fodder &fodder_r,
                const Indent &indent)
    {
        fill(fodder_l, false, false, indent.lineUp, indent.lineUp);
        column++;  // (
        const Fodder &first_inside = params.size() == 0 ? fodder_r : params[0].idFodder;

        Indent new_indent = newIndent(first_inside, indent, column);
        bool first = true;
        for (auto &param : params) {
            if (!first)
                column++;  // ','
            fill(param.idFodder, !first, true, new_indent.lineUp);
            column += param.id->name.length();
            if (param.expr != nullptr) {
                // default arg, no spacing: x=e
                fill(param.eqFodder, false, false, new_indent.lineUp);
                column++;
                expr(param.expr, new_indent, false);
            }
            fill(param.commaFodder, false, false, new_indent.lineUp);
            first = false;
        }
        if (trailing_comma)
            column++;
        fill(fodder_r, false, false, new_indent.lineUp, indent.lineUp);
        column++;  // )
    }